

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O1

EnumValue * __thiscall
google::protobuf::util::converter::FindEnumValueByNameOrNull
          (converter *this,Enum *enum_type,StringPiece enum_name)

{
  string *psVar1;
  Enum *__s1;
  char *size;
  bool bVar2;
  int iVar3;
  Type *pTVar4;
  Type *unaff_RBX;
  stringpiece_ssize_type len;
  int index;
  bool bVar5;
  
  if (this != (converter *)0x0) {
    bVar2 = 0 < *(int *)(this + 0x18);
    pTVar4 = unaff_RBX;
    if (0 < *(int *)(this + 0x18)) {
      index = 0;
      do {
        pTVar4 = protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValue>::TypeHandler>
                           ((RepeatedPtrFieldBase *)(this + 0x10),index);
        psVar1 = (pTVar4->name_).ptr_;
        __s1 = (Enum *)(psVar1->_M_dataplus)._M_p;
        size = (char *)psVar1->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        if (size == enum_name.ptr_) {
          bVar5 = true;
          if (0 < (long)size && __s1 != enum_type) {
            iVar3 = bcmp(__s1,enum_type,(size_t)size);
            bVar5 = iVar3 == 0;
          }
        }
        else {
          bVar5 = false;
        }
        if (bVar5) break;
        index = index + 1;
        bVar2 = index < *(int *)(this + 0x18);
        pTVar4 = unaff_RBX;
      } while (index < *(int *)(this + 0x18));
    }
    if (bVar2) {
      return pTVar4;
    }
  }
  return (EnumValue *)0x0;
}

Assistant:

const google::protobuf::EnumValue* FindEnumValueByNameOrNull(
    const google::protobuf::Enum* enum_type, StringPiece enum_name) {
  if (enum_type != nullptr) {
    for (int i = 0; i < enum_type->enumvalue_size(); ++i) {
      const google::protobuf::EnumValue& enum_value = enum_type->enumvalue(i);
      if (enum_value.name() == enum_name) {
        return &enum_value;
      }
    }
  }
  return nullptr;
}